

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultRawMemoryAllocator.cpp
# Opt level: O0

void * __thiscall
Diligent::DefaultRawMemoryAllocator::AllocateAligned
          (DefaultRawMemoryAllocator *this,size_t Size,size_t Alignment,Char *dbgDescription,
          char *dbgFileName,Int32 dbgLineNumber)

{
  Char *Message;
  unsigned_long *puVar1;
  void *pvVar2;
  unsigned_long local_70 [3];
  undefined1 local_58 [8];
  string msg;
  Int32 dbgLineNumber_local;
  char *dbgFileName_local;
  Char *dbgDescription_local;
  size_t Alignment_local;
  size_t Size_local;
  DefaultRawMemoryAllocator *this_local;
  
  msg.field_2._12_4_ = dbgLineNumber;
  dbgDescription_local = (Char *)Alignment;
  Alignment_local = Size;
  Size_local = (size_t)this;
  if ((Size == 0) || (Alignment == 0)) {
    FormatString<char[26],char[26]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Size > 0 && Alignment > 0",(char (*) [26])dbgDescription);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"AllocateAligned",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DefaultRawMemoryAllocator.cpp"
               ,0x75);
    std::__cxx11::string::~string((string *)local_58);
  }
  local_70[0] = 8;
  puVar1 = std::max<unsigned_long>((unsigned_long *)&dbgDescription_local,local_70);
  dbgDescription_local = (Char *)*puVar1;
  Alignment_local =
       AlignUp<unsigned_long,unsigned_long>(Alignment_local,(unsigned_long)dbgDescription_local);
  pvVar2 = (void *)aligned_alloc(dbgDescription_local,Alignment_local);
  return pvVar2;
}

Assistant:

void* DefaultRawMemoryAllocator::AllocateAligned(size_t Size, size_t Alignment, const Char* dbgDescription, const char* dbgFileName, const Int32 dbgLineNumber)
{
    VERIFY_EXPR(Size > 0 && Alignment > 0);
    // Alignment must be a power of two and a multiple of sizeof(void*))
    Alignment = std::max(Alignment, sizeof(void*));
    // Size must be an integral multiple of alignment,
    // or aligned_alloc will return null
    Size = AlignUp(Size, Alignment);
    return ALIGNED_MALLOC(Size, Alignment, dbgFileName, dbgLineNumber);
}